

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForHelp::~CallForHelp(CallForHelp *this)

{
  CallForHelp *this_local;
  
  ~CallForHelp(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

CallForHelp() : CallForHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}